

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::returnFromRun(Highs *this,HighsStatus run_return_status,bool undo_mods)

{
  __type _Var1;
  bool bVar2;
  HighsStatus HVar3;
  int iVar4;
  undefined8 uVar5;
  HighsLp *lp;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte in_DL;
  HighsStatus in_ESI;
  long in_RDI;
  bool solved_as_mip;
  HighsModelStatus in_stack_0000005c;
  HighsBasis *in_stack_00000060;
  HighsSolution *in_stack_00000068;
  bool have_basis;
  bool have_dual_solution;
  bool have_primal_solution;
  bool have_info;
  HighsOptions *in_stack_00000078;
  string *in_stack_00000080;
  HighsInfo *in_stack_00000090;
  HighsStatus return_status;
  HighsSolution *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  HighsModelStatus in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  HighsDebugStatus in_stack_ffffffffffffff5c;
  HighsSolution *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 uVar10;
  HighsOptions *in_stack_ffffffffffffff78;
  allocator<char> local_69;
  string local_68 [4];
  HighsStatus in_stack_ffffffffffffff9c;
  Highs *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffbc;
  Highs *in_stack_ffffffffffffffc0;
  Highs *in_stack_ffffffffffffffd0;
  
  HVar3 = highsStatusFromHighsModelStatus(*(HighsModelStatus *)(in_RDI + 0x1244));
  if (HVar3 != in_ESI) {
    in_stack_ffffffffffffff78 = (HighsOptions *)&stack0xffffffffffffffc8;
    modelStatusToString_abi_cxx11_
              ((Highs *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff54);
    uVar5 = std::__cxx11::string::c_str();
    printf("Highs::returnFromRun: return_status = %d != %d = run_return_status For model_status_ = %s\n"
           ,(ulong)(uint)HVar3,(ulong)(uint)in_ESI,uVar5);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  }
  lp = (HighsLp *)(ulong)*(uint *)(in_RDI + 0x1244);
  switch(lp) {
  case (HighsLp *)0x0:
  case (HighsLp *)0x1:
  case (HighsLp *)0x2:
  case (HighsLp *)0x3:
  case (HighsLp *)0x4:
  case (HighsLp *)0x5:
  case (HighsLp *)0x12:
    invalidateInfo((Highs *)0x48d174);
    invalidateSolution((Highs *)0x48d17e);
    invalidateBasis((Highs *)0x48d188);
    break;
  case (HighsLp *)0x6:
    invalidateInfo((Highs *)0x48d197);
    invalidateSolution((Highs *)0x48d1a1);
    invalidateBasis((Highs *)0x48d1ab);
    break;
  case (HighsLp *)0x7:
    break;
  case (HighsLp *)0x8:
  case (HighsLp *)0xa:
  case (HighsLp *)0xb:
  case (HighsLp *)0xc:
    break;
  case (HighsLp *)0x9:
    if ((((*(byte *)(in_RDI + 0xcb6) & 1) == 0) &&
        (((_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)lp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_ffffffffffffff6c,
                                                     in_stack_ffffffffffffff68)), !_Var1 ||
          (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)lp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_ffffffffffffff6c,
                                                     in_stack_ffffffffffffff68)), !_Var1)) &&
         (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)lp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_ffffffffffffff6c,
                                                    in_stack_ffffffffffffff68)), !_Var1)))) &&
       (bVar2 = HighsModel::isMip((HighsModel *)0x48d23b), !bVar2)) {
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                   "returnFromHighs: HighsModelStatus::kUnboundedOrInfeasible is not permitted\n");
    }
    break;
  case (HighsLp *)0xd:
  case (HighsLp *)0xe:
  case (HighsLp *)0xf:
  case (HighsLp *)0x10:
  case (HighsLp *)0x11:
  }
  bVar6 = *(byte *)(in_RDI + 0xeb0) & 1;
  bVar7 = *(byte *)(in_RDI + 8) & 1;
  bVar8 = *(byte *)(in_RDI + 9) & 1;
  bVar9 = *(byte *)(in_RDI + 0x70) & 1;
  uVar10 = *(undefined4 *)(in_RDI + 0x1244);
  if (bVar7 != 0) {
    debugPrimalSolutionRightSize
              ((HighsOptions *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (HighsLp *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
  }
  if ((bVar8 & 1) != 0) {
    debugDualSolutionRightSize
              ((HighsOptions *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (HighsLp *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
  }
  if ((bVar9 & 1) != 0) {
    debugBasisRightSize((HighsOptions *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                        (HighsLp *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        (HighsBasis *)in_stack_ffffffffffffff48);
  }
  if ((bVar7 & 1) != 0) {
    in_stack_ffffffffffffff60 = (HighsSolution *)&local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_68,"Return from run()",(allocator *)in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff5c =
         debugHighsSolution(in_stack_00000080,in_stack_00000078,_have_basis,in_stack_00000068,
                            in_stack_00000060,in_stack_0000005c,in_stack_00000090);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  debugInfo(in_stack_ffffffffffffff78,lp,(HighsBasis *)CONCAT44(uVar10,in_stack_ffffffffffffff68),
            in_stack_ffffffffffffff60,
            (HighsInfo *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
            in_stack_ffffffffffffff54);
  *(undefined1 *)(in_RDI + 0x4bfc) = 1;
  if ((in_DL & 1) != 0) {
    restoreInfCost(in_stack_ffffffffffffffc0,
                   (HighsStatus *)
                   CONCAT44(in_stack_ffffffffffffffbc,
                            CONCAT13(bVar6,CONCAT12(bVar7,CONCAT11(bVar8,bVar9)))));
    HighsLp::unapplyMods((HighsLp *)in_stack_ffffffffffffffd0);
  }
  iVar4 = std::__cxx11::string::compare((string *)(in_RDI + 0xad0));
  bVar6 = 0;
  if (iVar4 == 0) {
    bVar2 = HighsModel::isMip((HighsModel *)0x48d52b);
    bVar6 = 0;
    if (bVar2) {
      bVar6 = *(byte *)(in_RDI + 0xcb5) ^ 0xff;
    }
  }
  if ((bVar6 & 1) == 0) {
    reportSolvedLpQpStats(in_stack_ffffffffffffffd0);
  }
  HVar3 = returnFromHighs(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  return HVar3;
}

Assistant:

HighsStatus Highs::returnFromRun(const HighsStatus run_return_status,
                                 const bool undo_mods) {
  assert(!called_return_from_run);
  HighsStatus return_status = highsStatusFromHighsModelStatus(model_status_);
  if (return_status != run_return_status) {
    printf(
        "Highs::returnFromRun: return_status = %d != %d = run_return_status "
        "For model_status_ = %s\n",
        int(return_status), int(run_return_status),
        modelStatusToString(model_status_).c_str());
  }
  assert(return_status == run_return_status);
  //  return_status = run_return_status;
  switch (model_status_) {
      // First consider the error returns
    case HighsModelStatus::kNotset:
    case HighsModelStatus::kLoadError:
    case HighsModelStatus::kModelError:
    case HighsModelStatus::kPresolveError:
    case HighsModelStatus::kSolveError:
    case HighsModelStatus::kPostsolveError:
    case HighsModelStatus::kMemoryLimit:
      // Don't clear the model status!
      //      invalidateSolverData();
      invalidateInfo();
      invalidateSolution();
      invalidateBasis();
      assert(return_status == HighsStatus::kError);
      break;

      // Then consider the OK returns
    case HighsModelStatus::kModelEmpty:
      invalidateInfo();
      invalidateSolution();
      invalidateBasis();
      assert(return_status == HighsStatus::kOk);
      break;

    case HighsModelStatus::kOptimal:
      // The following is an aspiration
      //
      // assert(info_.primal_solution_status == kSolutionStatusFeasible);
      //
      // assert(info_.dual_solution_status == kSolutionStatusFeasible);
      assert(model_status_ == HighsModelStatus::kNotset ||
             model_status_ == HighsModelStatus::kOptimal);
      assert(return_status == HighsStatus::kOk);
      break;

    case HighsModelStatus::kInfeasible:
    case HighsModelStatus::kUnbounded:
    case HighsModelStatus::kObjectiveBound:
    case HighsModelStatus::kObjectiveTarget:
      // For kInfeasible, will not have a basis, if infeasibility was
      // detected in presolve or by IPX without crossover
      assert(return_status == HighsStatus::kOk);
      break;

    case HighsModelStatus::kUnboundedOrInfeasible:
      if (options_.allow_unbounded_or_infeasible ||
          (options_.solver == kIpmString &&
           options_.run_crossover == kHighsOnString) ||
          (options_.solver == kPdlpString) || model_.isMip()) {
        assert(return_status == HighsStatus::kOk);
      } else {
        // This model status is not permitted unless IPM is run without
        // crossover, or if PDLP is used
        highsLogUser(
            options_.log_options, HighsLogType::kError,
            "returnFromHighs: HighsModelStatus::kUnboundedOrInfeasible is not "
            "permitted\n");
        assert(options_.allow_unbounded_or_infeasible);
        return_status = HighsStatus::kError;
      }
      break;

      // Finally consider the warning returns
    case HighsModelStatus::kTimeLimit:
    case HighsModelStatus::kIterationLimit:
    case HighsModelStatus::kSolutionLimit:
    case HighsModelStatus::kInterrupt:
    case HighsModelStatus::kUnknown:
      assert(return_status == HighsStatus::kWarning);
      break;
    default:
      // All cases should have been considered so assert on reaching here
      assert(1 == 0);
  }
  // Now to check what's available with each model status
  //
  const bool have_info = info_.valid;
  const bool have_primal_solution = solution_.value_valid;
  const bool have_dual_solution = solution_.dual_valid;
  // Can't have a dual solution without a primal solution
  assert(have_primal_solution || !have_dual_solution);
  //  const bool have_solution = have_primal_solution && have_dual_solution;
  const bool have_basis = basis_.valid;
  switch (model_status_) {
    case HighsModelStatus::kNotset:
    case HighsModelStatus::kLoadError:
    case HighsModelStatus::kModelError:
    case HighsModelStatus::kPresolveError:
    case HighsModelStatus::kSolveError:
    case HighsModelStatus::kPostsolveError:
    case HighsModelStatus::kModelEmpty:
    case HighsModelStatus::kMemoryLimit:
      // No info, primal solution or basis
      assert(have_info == false);
      assert(have_primal_solution == false);
      assert(have_basis == false);
      break;
    case HighsModelStatus::kOptimal:
    case HighsModelStatus::kInfeasible:
    case HighsModelStatus::kUnbounded:
    case HighsModelStatus::kObjectiveBound:
    case HighsModelStatus::kObjectiveTarget:
    case HighsModelStatus::kUnboundedOrInfeasible:
    case HighsModelStatus::kTimeLimit:
    case HighsModelStatus::kIterationLimit:
    case HighsModelStatus::kSolutionLimit:
    case HighsModelStatus::kInterrupt:
    case HighsModelStatus::kUnknown:
      // Have info and primal solution (unless infeasible). No primal solution
      // in some other case, too!
      assert(have_info == true);
      break;
    default:
      // All cases should have been considered so assert on reaching here
      assert(1 == 0);
  }
  if (have_primal_solution) {
    if (debugPrimalSolutionRightSize(options_, model_.lp_, solution_) ==
        HighsDebugStatus::kLogicalError)
      return_status = HighsStatus::kError;
  }
  if (have_dual_solution) {
    if (debugDualSolutionRightSize(options_, model_.lp_, solution_) ==
        HighsDebugStatus::kLogicalError)
      return_status = HighsStatus::kError;
  }
  if (have_basis) {
    if (debugBasisRightSize(options_, model_.lp_, basis_) ==
        HighsDebugStatus::kLogicalError)
      return_status = HighsStatus::kError;
  }
  if (have_primal_solution) {
    // Debug the Highs solution - needs primal values at least
    if (debugHighsSolution("Return from run()", options_, model_, solution_,
                           basis_, model_status_,
                           info_) == HighsDebugStatus::kLogicalError)
      return_status = HighsStatus::kError;
  }
  if (debugInfo(options_, model_.lp_, basis_, solution_, info_,
                model_status_) == HighsDebugStatus::kLogicalError)
    return_status = HighsStatus::kError;

  // Record that returnFromRun() has been called
  called_return_from_run = true;

  if (undo_mods) {
    // Restore any infinite costs
    this->restoreInfCost(return_status);

    // Unapply any modifications that have not yet been unapplied
    this->model_.lp_.unapplyMods();
    //    undo_mods = false;
  }

  // Unless solved as a MIP, report on the solution
  const bool solved_as_mip = !options_.solver.compare(kHighsChooseString) &&
                             model_.isMip() && !options_.solve_relaxation;
  if (!solved_as_mip) reportSolvedLpQpStats();
  return returnFromHighs(return_status);
}